

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_service_interface
          (t_netstd_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_struct *ptVar3;
  t_function *ptVar4;
  t_service *scope;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  iterator iVar8;
  size_type *psVar9;
  long *plVar10;
  char *__end;
  pointer pptVar11;
  t_netstd_generator *this_00;
  pointer pptVar12;
  string extends_iface;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends;
  string local_140;
  ostream *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  pointer local_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  t_service *local_b0;
  vector<t_function_*,_std::allocator<t_function_*>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_120 = out;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"","");
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_140,this,&tservice->extends_->super_t_type,true);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_140);
    paVar2 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    std::operator+(&local_118," : ",&local_90);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140.field_2._8_8_ = plVar6[3];
      local_140._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar9;
      local_140._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_140._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  generate_netstd_doc(this,local_120,(t_doc *)tservice);
  if (this->wcf_ == true) {
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ServiceContract(Namespace=\"",0x1c);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(this->wcf_namespace_)._M_dataplus._M_p,
                        (this->wcf_namespace_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")]",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  iVar5 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  prepare_member_name_mapping
            (this,tservice,&tservice->functions_,(string *)CONCAT44(extraout_var,iVar5));
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public interface IAsync",0x17);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_d0,local_c8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_b0 = tservice;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_a8,&tservice->functions_);
  if (local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar11 = local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      local_f8 = pptVar11;
      generate_netstd_doc(this,local_120,*pptVar11);
      if (this->wcf_ == true) {
        t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[OperationContract]",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        ptVar3 = (*local_f8)->xceptions_;
        for (pptVar12 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pptVar12 !=
            (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
          t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
          type_name_abi_cxx11_(&local_50,this,(*pptVar12)->type_,true);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x39d7ff);
          local_f0 = &local_e0;
          plVar10 = plVar6 + 2;
          if ((long *)*plVar6 == plVar10) {
            local_e0 = *plVar10;
            lStack_d8 = plVar6[3];
          }
          else {
            local_e0 = *plVar10;
            local_f0 = (long *)*plVar6;
          }
          local_e8 = plVar6[1];
          *plVar6 = (long)plVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_118.field_2._M_allocated_capacity = *psVar9;
            local_118.field_2._8_8_ = plVar6[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar9;
            local_118._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_118._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
        }
      }
      ptVar4 = *local_f8;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"deprecated","");
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(ptVar4->annotations_)._M_t,&local_140);
      pptVar11 = local_f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if (&((*pptVar11)->annotations_)._M_t._M_impl.super__Rb_tree_header !=
          (_Rb_tree_header *)iVar8._M_node) {
        t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[Obsolete",9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if (iVar8._M_node[2]._M_parent != (_Base_ptr)0x0) {
          iVar5 = std::__cxx11::string::compare((char *)(iVar8._M_node + 2));
          if (iVar5 != 0) {
            this_00 = (t_netstd_generator *)0x3a1f75;
            std::__ostream_insert<char,std::char_traits<char>>(local_120,"(",1);
            make_csharp_string_literal(&local_140,this_00,(string *)(iVar8._M_node + 2));
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p);
            }
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_120,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_120,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
      ptVar4 = *pptVar11;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      function_signature_async(&local_118,this,ptVar4,&local_70,0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_120,local_140._M_dataplus._M_p,local_140._M_string_length);
  scope = local_b0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  cleanup_member_name_mapping(this,scope);
  if (local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_service_interface(ostream& out, t_service* tservice)
{
    string extends = "";
    string extends_iface = "";
    if (tservice->get_extends() != nullptr)
    {
        extends = type_name(tservice->get_extends());
        extends_iface = " : " + extends + ".IAsync";
    }

    //out << endl << endl;

    generate_netstd_doc(out, tservice);

    if (is_wcf_enabled())
    {
        out << indent() << "[ServiceContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    prepare_member_name_mapping(tservice);
    out << indent() << "public interface IAsync" << extends_iface << endl
        << indent() << "{" << endl;

    indent_up();
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        generate_netstd_doc(out, *f_iter);

        // if we're using WCF, add the corresponding attributes
        if (is_wcf_enabled())
        {
            out << indent() << "[OperationContract]" << endl;

            const vector<t_field*>& xceptions = (*f_iter)->get_xceptions()->get_members();
            vector<t_field*>::const_iterator x_iter;
            for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter)
            {
                out << indent() << "[FaultContract(typeof(" + type_name((*x_iter)->get_type()) + "Fault))]" << endl;
            }
        }

        auto iter = (*f_iter)->annotations_.find("deprecated");
        if( (*f_iter)->annotations_.end() != iter) {
          out << indent() << "[Obsolete";
          // empty annotation values end up with "1" somewhere, ignore these as well
          if ((iter->second.length() > 0) && (iter->second != "1")) {
            out << "(" << make_csharp_string_literal(iter->second) << ")";
          }
          out << "]" << endl;
        }

        out << indent() << function_signature_async(*f_iter) << ";" << endl << endl;
    }
    indent_down();
    out << indent() << "}" << endl << endl;
    cleanup_member_name_mapping(tservice);
}